

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jemalloc.c
# Opt level: O3

void * do_rallocx(void *ptr,size_t size,int flags,_Bool is_realloc)

{
  ulong *puVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  size_t oldsize;
  void **ppvVar4;
  uint64_t uVar5;
  ulong uVar6;
  undefined8 uVar7;
  bool bVar8;
  _Bool _Var9;
  tcaches_t *ptVar10;
  tsd_t *tsd;
  ulong uVar11;
  rtree_leaf_elm_t *prVar12;
  int *piVar13;
  void *__dest;
  anon_union_8_2_150e8edc_for_tcaches_s_0 tcache;
  arena_t *arena;
  ulong uVar14;
  size_t sVar15;
  ulong alignment;
  uint uVar16;
  long lVar17;
  cache_bin_t *cache_bin;
  rtree_t *rtree;
  _Bool zero;
  size_t excess_len;
  rtree_ctx_t *ctx;
  size_t sVar19;
  hook_ralloc_args_t hook_args;
  rtree_contents_t local_1c8;
  rtree_ctx_t rtree_ctx_fallback;
  byte bVar18;
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_02493488);
  if ((tsd->state).repr != '\0') {
    tsd = duckdb_je_tsd_fetch_slow(tsd,false);
  }
  _Var9 = duckdb_je_opt_zero;
  bVar18 = (byte)((flags & 0x40U) >> 6);
  zero = (_Bool)(bVar18 | duckdb_je_opt_zero);
  if ((uint)flags < 0x100000) {
LAB_01c29212:
    arena = (arena_t *)0x0;
  }
  else {
    uVar16 = ((uint)flags >> 0x14) - 1;
    arena = (arena_t *)duckdb_je_arenas[uVar16].repr;
    if (arena == (arena_t *)0x0) {
      arena = duckdb_je_arena_init((tsdn_t *)tsd,uVar16,&duckdb_je_arena_config_default);
    }
    if (arena == (arena_t *)0x0) {
      if (duckdb_je_narenas_auto <= uVar16) goto LAB_01c293c4;
      goto LAB_01c29212;
    }
  }
  ptVar10 = duckdb_je_tcaches;
  uVar16 = flags & 0xfff00;
  if (uVar16 == 0) {
LAB_01c29224:
    tcache.tcache = (tcache_t *)0x0;
    if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache_enabled != false) {
      tcache.tcache = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_tcache;
    }
LAB_01c29235:
    ctx = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    bVar8 = false;
  }
  else {
    if ((uVar16 == 0x100) || (uVar16 >> 8 == 1)) {
      tcache.tcache = (tcache_t *)0x0;
    }
    else {
      if (uVar16 == 0) goto LAB_01c29224;
      uVar16 = (uVar16 >> 8) - 2;
      tcache = (anon_union_8_2_150e8edc_for_tcaches_s_0)duckdb_je_tcaches[uVar16].field_0.tcache;
      if (tcache == (tcache_t *)0x0) {
        duckdb_je_malloc_printf("<jemalloc>: invalid tcache id (%u).\n");
        abort();
      }
      if (tcache == (tcache_t *)&DAT_00000001) {
        tcache.tcache = duckdb_je_tcache_create_explicit(tsd);
        ptVar10[uVar16].field_0.tcache = (tcache_t *)tcache;
      }
    }
    if (tsd != (tsd_t *)0x0) goto LAB_01c29235;
    ctx = &rtree_ctx_fallback;
    duckdb_je_rtree_ctx_data_init(ctx);
    bVar8 = true;
  }
  alignment = 1L << ((byte)flags & 0x3f) & 0xfffffffffffffffe;
  uVar11 = (ulong)ptr & 0xffffffffc0000000;
  uVar14 = (ulong)(((uint)((ulong)ptr >> 0x1e) & 0xf) << 4);
  puVar1 = (ulong *)((long)&ctx->cache[0].leafkey + uVar14);
  uVar14 = *(ulong *)((long)&ctx->cache[0].leafkey + uVar14);
  if (uVar14 == uVar11) {
    prVar12 = (rtree_leaf_elm_t *)((ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8) + puVar1[1]);
  }
  else if (ctx->l2_cache[0].leafkey == uVar11) {
    prVar12 = ctx->l2_cache[0].leaf;
    ctx->l2_cache[0].leafkey = uVar14;
    ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar1[1];
    *puVar1 = uVar11;
    puVar1[1] = (ulong)prVar12;
    prVar12 = (rtree_leaf_elm_t *)
              ((long)&(prVar12->le_bits).repr + (ulong)((uint)((ulong)ptr >> 9) & 0x1ffff8));
  }
  else {
    lVar17 = 0x118;
    do {
      if (*(ulong *)((long)ctx->cache + lVar17 + -8) == uVar11) {
        uVar6 = *(ulong *)((long)&ctx->cache[0].leafkey + lVar17);
        puVar2 = (undefined8 *)((long)ctx->cache + lVar17 + -0x18);
        uVar7 = puVar2[1];
        puVar3 = (undefined8 *)((long)ctx->cache + lVar17 + -8);
        *puVar3 = *puVar2;
        puVar3[1] = uVar7;
        *(ulong *)((long)ctx->cache + lVar17 + -0x18) = uVar14;
        *(ulong *)((long)(ctx->cache + -1) + lVar17) = puVar1[1];
        *puVar1 = uVar11;
        puVar1[1] = uVar6;
        prVar12 = (rtree_leaf_elm_t *)(((uint)((ulong)ptr >> 9) & 0x1ffff8) + uVar6);
        goto LAB_01c2927c;
      }
      lVar17 = lVar17 + 0x10;
    } while (lVar17 != 0x188);
    prVar12 = duckdb_je_rtree_leaf_elm_lookup_hard
                        ((tsdn_t *)tsd,&duckdb_je_arena_emap_global.rtree,ctx,(uintptr_t)ptr,true,
                         false);
  }
LAB_01c2927c:
  oldsize = duckdb_je_sz_index2size_tab[(ulong)(prVar12->le_bits).repr >> 0x30];
  if (alignment == 0) {
    if (size < 0x1001) {
      sVar19 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[size + 7 >> 3]];
    }
    else {
      if (0x7000000000000000 < size) goto LAB_01c293c4;
      uVar14 = size * 2 - 1;
      lVar17 = 0x3f;
      if (uVar14 != 0) {
        for (; uVar14 >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      uVar14 = -1L << (0x3c - ((byte)lVar17 ^ 0x3f) & 0x3f);
      sVar19 = ~uVar14 + size & uVar14;
    }
  }
  else {
    if (alignment < 0x1001 && size < 0x3801) {
      uVar14 = -alignment & (size + alignment) - 1;
      if (uVar14 < 0x1001) {
        sVar19 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar14 + 7 >> 3]];
      }
      else {
        uVar11 = uVar14 * 2 - 1;
        lVar17 = 0x3f;
        if (uVar11 != 0) {
          for (; uVar11 >> lVar17 == 0; lVar17 = lVar17 + -1) {
          }
        }
        uVar11 = -1L << (0x3c - ((byte)lVar17 ^ 0x3f) & 0x3f);
        sVar19 = ~uVar11 + uVar14 & uVar11;
      }
      uVar14 = 0x4000;
      if (sVar19 < 0x4000) goto LAB_01c293ad;
    }
    else {
      if (0x7000000000000000 < alignment) goto LAB_01c293c4;
      uVar14 = 0x4000;
      if (0x4000 < size) {
        if (size < 0x7000000000000001) {
          uVar14 = size * 2 - 1;
          lVar17 = 0x3f;
          if (uVar14 != 0) {
            for (; uVar14 >> lVar17 == 0; lVar17 = lVar17 + -1) {
            }
          }
          uVar14 = -1L << (0x3c - ((byte)lVar17 ^ 0x3f) & 0x3f);
          uVar14 = ~uVar14 + size & uVar14;
        }
        else {
          uVar14 = 0;
        }
        if (uVar14 < size) goto LAB_01c293c4;
      }
    }
    sVar19 = 0;
    if (uVar14 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar14) -
                  0x1000) {
      sVar19 = uVar14;
    }
  }
LAB_01c293ad:
  if (sVar19 + 0x8fffffffffffffff < 0x9000000000000000) goto LAB_01c293c4;
  hook_args.args[2] = (uintptr_t)flags;
  hook_args.args[3] = 0;
  hook_args.is_realloc = is_realloc;
  hook_args.args[0] = (uintptr_t)ptr;
  hook_args.args[1] = size;
  if ((alignment == 0) || ((alignment - 1 & (ulong)ptr) == 0)) {
    __dest = duckdb_je_arena_ralloc
                       ((tsdn_t *)tsd,arena,ptr,oldsize,size,alignment,zero,sVar19 < 0x3801,
                        tcache.tcache,&hook_args);
    if (__dest == (void *)0x0) goto LAB_01c293c4;
    goto LAB_01c29656;
  }
  if (alignment < 0x1001 && size < 0x3801) {
    uVar14 = -alignment & (alignment - 1) + size;
    if (uVar14 < 0x1001) {
      sVar15 = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[uVar14 + 7 >> 3]];
    }
    else {
      uVar11 = uVar14 * 2 - 1;
      lVar17 = 0x3f;
      if (uVar11 != 0) {
        for (; uVar11 >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      uVar11 = -1L << (0x3c - ((byte)lVar17 ^ 0x3f) & 0x3f);
      sVar15 = ~uVar11 + uVar14 & uVar11;
    }
    uVar14 = 0x4000;
    if (0x3fff < sVar15) goto LAB_01c2951c;
  }
  else {
    uVar14 = 0x4000;
    if (0x4000 < size) {
      if (size < 0x7000000000000001) {
        uVar14 = size * 2 - 1;
        lVar17 = 0x3f;
        if (uVar14 != 0) {
          for (; uVar14 >> lVar17 == 0; lVar17 = lVar17 + -1) {
          }
        }
        uVar14 = -1L << (0x3c - ((byte)lVar17 ^ 0x3f) & 0x3f);
        uVar14 = ~uVar14 + size & uVar14;
      }
      else {
        uVar14 = 0;
      }
      if (uVar14 < size) goto LAB_01c293c4;
    }
LAB_01c2951c:
    sVar15 = 0;
    if (uVar14 <= (duckdb_je_sz_large_pad + (alignment + 0xfff & 0x7ffffffffffff000) + uVar14) -
                  0x1000) {
      sVar15 = uVar14;
    }
  }
  if ((sVar15 + 0x8fffffffffffffff < 0x9000000000000000) ||
     (__dest = duckdb_je_arena_palloc
                         ((tsdn_t *)tsd,arena,sVar15,alignment,zero,sVar19 < 0x3801,tcache.tcache),
     __dest == (void *)0x0)) {
LAB_01c293c4:
    if (is_realloc) {
      piVar13 = __errno_location();
      *piVar13 = 0xc;
    }
    return (void *)0x0;
  }
  if (oldsize <= size) {
    size = oldsize;
  }
  switchD_015de399::default(__dest,ptr,size);
  duckdb_je_hook_invoke_alloc
            (hook_args.is_realloc ^ hook_alloc_rallocx,__dest,(uintptr_t)__dest,hook_args.args);
  duckdb_je_hook_invoke_dalloc(hook_dalloc_rallocx - hook_args.is_realloc,ptr,hook_args.args);
  if (tcache.tcache == (tcache_t *)0x0) {
    arena_sdalloc_no_tcache((tsdn_t *)tsd,ptr,oldsize);
    goto LAB_01c29656;
  }
  if (oldsize < 0x1001) {
    uVar16 = (uint)duckdb_je_sz_size2index_tab[oldsize + 7 >> 3];
  }
  else {
    uVar16 = sz_size2index_compute(oldsize);
  }
  if (uVar16 < 0x24) {
    cache_bin = (tcache.tcache)->bins + uVar16;
    ppvVar4 = cache_bin->stack_head;
    if ((tcache.tcache)->bins[uVar16].low_bits_full != (uint16_t)ppvVar4) {
      cache_bin->stack_head = ppvVar4 + -1;
      ppvVar4[-1] = ptr;
      goto LAB_01c29656;
    }
    if (ppvVar4 == (void **)&duckdb_je_disabled_bin) {
      duckdb_je_arena_dalloc_small((tsdn_t *)tsd,ptr);
      goto LAB_01c29656;
    }
    duckdb_je_tcache_bin_flush_small
              (tsd,tcache.tcache,cache_bin,uVar16,
               (uint)((tcache.tcache)->bins[uVar16].bin_info.ncached_max >>
                     ((byte)duckdb_je_opt_lg_tcache_flush_small_div & 0x1f)));
LAB_01c299d8:
    ppvVar4 = cache_bin->stack_head;
    if (cache_bin->low_bits_full != (uint16_t)ppvVar4) {
      cache_bin->stack_head = ppvVar4 + -1;
      ppvVar4[-1] = ptr;
    }
  }
  else {
    if (uVar16 < (tcache.tcache)->tcache_slow->tcache_nbins) {
      ppvVar4 = (tcache.tcache)->bins[uVar16].stack_head;
      if (ppvVar4 != (void **)&duckdb_je_disabled_bin) {
        cache_bin = (tcache.tcache)->bins + uVar16;
        if ((tcache.tcache)->bins[uVar16].low_bits_full != (uint16_t)ppvVar4) {
          cache_bin->stack_head = ppvVar4 + -1;
          ppvVar4[-1] = ptr;
          goto LAB_01c29656;
        }
        duckdb_je_tcache_bin_flush_large
                  (tsd,tcache.tcache,cache_bin,uVar16,
                   (uint)((tcache.tcache)->bins[uVar16].bin_info.ncached_max >>
                         ((byte)duckdb_je_opt_lg_tcache_flush_large_div & 0x1f)));
        goto LAB_01c299d8;
      }
    }
    sVar15 = oldsize;
    if (bVar8) {
      rtree = (rtree_t *)&rtree_ctx_fallback;
      duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
    }
    else {
      rtree = (rtree_t *)&tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
    }
    rtree_read(&local_1c8,(tsdn_t *)tsd,rtree,(rtree_ctx_t *)ptr,sVar15);
    duckdb_je_large_dalloc((tsdn_t *)tsd,local_1c8.edata);
  }
LAB_01c29656:
  rtree_ctx_fallback.cache[0].leafkey._0_1_ = 1;
  rtree_ctx_fallback.cache[0].leaf =
       (rtree_leaf_elm_t *)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
  rtree_ctx_fallback.cache[1].leafkey =
       (uintptr_t)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_last_event;
  rtree_ctx_fallback.cache[1].leaf =
       (rtree_leaf_elm_t *)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event;
  rtree_ctx_fallback.cache[2].leafkey =
       (uintptr_t)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event_fast;
  uVar5 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated = uVar5 + sVar19;
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_allocated_next_event - uVar5
      <= sVar19) {
    duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&rtree_ctx_fallback);
  }
  rtree_ctx_fallback.cache[0].leafkey._0_1_ = 0;
  rtree_ctx_fallback.cache[0].leaf =
       (rtree_leaf_elm_t *)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  rtree_ctx_fallback.cache[1].leafkey =
       (uintptr_t)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_last_event;
  rtree_ctx_fallback.cache[1].leaf =
       (rtree_leaf_elm_t *)
       &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event;
  rtree_ctx_fallback.cache[2].leafkey =
       (uintptr_t)
       &tsd->
        cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event_fast;
  uVar5 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated;
  tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated = uVar5 + oldsize;
  if (tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_thread_deallocated_next_event -
      uVar5 <= oldsize) {
    duckdb_je_te_event_trigger(tsd,(te_ctx_t *)&rtree_ctx_fallback);
  }
  if (duckdb_je_opt_junk_alloc != true) {
    return __dest;
  }
  if ((sVar19 < oldsize || sVar19 - oldsize == 0) || (bVar18 != 0 || (_Var9 & 1U) != 0)) {
    return __dest;
  }
  switchD_01043a80::default((void *)(oldsize + (long)__dest),0xa5,sVar19 - oldsize);
  return __dest;
}

Assistant:

static void *
do_rallocx(void *ptr, size_t size, int flags, bool is_realloc) {
	void *p;
	tsd_t *tsd;
	size_t usize;
	size_t old_usize;
	size_t alignment = MALLOCX_ALIGN_GET(flags);
	arena_t *arena;

	assert(ptr != NULL);
	assert(size != 0);
	assert(malloc_initialized() || IS_INITIALIZER);
	tsd = tsd_fetch();
	check_entry_exit_locking(tsd_tsdn(tsd));

	bool zero = zero_get(MALLOCX_ZERO_GET(flags), /* slow */ true);

	unsigned arena_ind = mallocx_arena_get(flags);
	if (arena_get_from_ind(tsd, arena_ind, &arena)) {
		goto label_oom;
	}

	unsigned tcache_ind = mallocx_tcache_get(flags);
	tcache_t *tcache = tcache_get_from_ind(tsd, tcache_ind,
	    /* slow */ true, /* is_alloc */ true);

	emap_alloc_ctx_t alloc_ctx;
	emap_alloc_ctx_lookup(tsd_tsdn(tsd), &arena_emap_global, ptr,
	    &alloc_ctx);
	assert(alloc_ctx.szind != SC_NSIZES);
	old_usize = sz_index2size(alloc_ctx.szind);
	assert(old_usize == isalloc(tsd_tsdn(tsd), ptr));
	if (aligned_usize_get(size, alignment, &usize, NULL, false)) {
		goto label_oom;
	}

	hook_ralloc_args_t hook_args = {is_realloc, {(uintptr_t)ptr, size,
		flags, 0}};
	if (config_prof && opt_prof) {
		p = irallocx_prof(tsd, ptr, old_usize, size, alignment, usize,
		    zero, tcache, arena, &alloc_ctx, &hook_args);
		if (unlikely(p == NULL)) {
			goto label_oom;
		}
	} else {
		p = iralloct(tsd_tsdn(tsd), ptr, old_usize, size, alignment,
		    usize, zero, tcache, arena, &hook_args);
		if (unlikely(p == NULL)) {
			goto label_oom;
		}
		assert(usize == isalloc(tsd_tsdn(tsd), p));
	}
	assert(alignment == 0 || ((uintptr_t)p & (alignment - 1)) == ZU(0));
	thread_alloc_event(tsd, usize);
	thread_dalloc_event(tsd, old_usize);

	UTRACE(ptr, size, p);
	check_entry_exit_locking(tsd_tsdn(tsd));

	if (config_fill && unlikely(opt_junk_alloc) && usize > old_usize
	    && !zero) {
		size_t excess_len = usize - old_usize;
		void *excess_start = (void *)((byte_t *)p + old_usize);
		junk_alloc_callback(excess_start, excess_len);
	}

	return p;
label_oom:
	if (is_realloc) {
		set_errno(ENOMEM);
	}
	if (config_xmalloc && unlikely(opt_xmalloc)) {
		malloc_write("<jemalloc>: Error in rallocx(): out of memory\n");
		abort();
	}
	UTRACE(ptr, size, 0);
	check_entry_exit_locking(tsd_tsdn(tsd));

	return NULL;
}